

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

size_t quantize_iq3_s(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  undefined8 *puVar1;
  byte *pbVar2;
  uint32_t uVar3;
  char cVar4;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [14];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined8 uVar17;
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [13];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  uint6 uVar26;
  uint32_t *grid;
  int *piVar27;
  uint16_t *puVar28;
  int i;
  uint uVar29;
  long lVar30;
  float *pfVar31;
  long lVar32;
  ulong uVar33;
  float *pfVar34;
  int i_1;
  int iVar35;
  int8_t *L_00;
  char *pcVar36;
  byte bVar37;
  ushort *puVar38;
  char *pcVar39;
  ushort *puVar40;
  int k_1;
  float *pfVar41;
  short sVar42;
  ushort uVar44;
  ushort uVar45;
  anon_union_4_2_5fd15f10 fp32;
  short sVar43;
  float fVar46;
  float fVar47;
  ushort uVar65;
  float fVar67;
  float fVar73;
  undefined1 auVar49 [16];
  float fVar68;
  int iVar69;
  int iVar74;
  int iVar75;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar70;
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar63;
  ushort uVar64;
  ushort uVar66;
  ushort uVar71;
  ushort uVar72;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  undefined1 auVar76 [15];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint8_t block_signs [4];
  _Bool is_on_grid_aux [8];
  _Bool is_on_grid [8];
  int8_t Laux [32];
  int8_t L [32];
  float scales [8];
  float xval [32];
  float weight [32];
  float waux [32];
  uint local_30c;
  float *local_308;
  ushort *local_300;
  long local_2f8;
  ushort *local_2f0;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  long local_2b0;
  float *local_2a8;
  ulong local_2a0;
  void *local_298;
  float *local_290;
  float *local_288;
  uint *local_280;
  undefined8 local_278;
  float *local_270;
  undefined8 local_268;
  undefined8 local_260;
  long local_258;
  long local_250;
  int64_t local_248;
  long local_240;
  ulong local_238;
  float *local_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8 [4];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8 [98];
  char cVar5;
  char cVar6;
  char cVar7;
  undefined6 uVar48;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 uVar61;
  undefined2 uVar62;
  
  local_2a8 = src;
  local_298 = dst;
  local_288 = quant_weights;
  if ((char)n_per_row != '\0') {
    pcVar39 = "n_per_row%QK_K == 0";
    iVar35 = 0xf7a;
LAB_001378c5:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,iVar35,"GGML_ASSERT(%s) failed",pcVar39);
  }
  local_2b0 = n_per_row >> 8;
  if (0 < nrow) {
    local_2a0 = (ulong)(uint)((int)n_per_row >> 8);
    local_258 = local_2b0 * 0x6e;
    local_250 = n_per_row << 2;
    lVar30 = 0;
    auVar90 = _DAT_0014e990;
    auVar91 = _DAT_0014e690;
    local_248 = nrow;
    do {
      puVar28 = iq3_data[1].neighbours;
      piVar27 = iq3_data[1].map;
      grid = iq3_data[1].grid;
      if (iq3_data[1].grid == (uint32_t *)0x0) {
        pcVar39 = "kgrid_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar35 = 0xed5;
        goto LAB_001378c5;
      }
      if (iq3_data[1].map == (int *)0x0) {
        pcVar39 = "kmap_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar35 = 0xed6;
        goto LAB_001378c5;
      }
      if (iq3_data[1].neighbours == (uint16_t *)0x0) {
        pcVar39 = "kneighbors_q3xs && \"forgot to call ggml_quantize_init()?\"";
        iVar35 = 0xed7;
        goto LAB_001378c5;
      }
      local_240 = lVar30;
      if (0 < (int)local_2a0) {
        local_290 = local_288;
        uVar33 = 0;
        pfVar41 = local_2a8;
        do {
          lVar30 = uVar33 * 0x6e;
          puVar40 = (ushort *)((long)local_298 + lVar30);
          puVar1 = (undefined8 *)((long)local_298 + lVar30 + 0x5e);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_298 + lVar30 + 0x50);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_298 + lVar30 + 0x40);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_298 + lVar30 + 0x30);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_298 + lVar30 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_298 + lVar30 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)local_298 + lVar30) = 0;
          ((undefined8 *)((long)local_298 + lVar30))[1] = 0;
          auVar80 = ZEXT816(0);
          lVar30 = 0;
          do {
            fVar85 = auVar80._0_4_ + pfVar41[lVar30] * pfVar41[lVar30];
            auVar80._0_4_ = fVar85;
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0x100);
          puVar38 = puVar40 + 1;
          local_280 = (uint *)(puVar40 + 0x25);
          local_2e4 = (fVar85 + fVar85) * 0.00390625;
          fVar85 = 0.0;
          local_270 = local_290;
          lVar30 = 0;
          local_308 = pfVar41;
          local_300 = puVar40;
          local_238 = uVar33;
          local_230 = pfVar41;
          do {
            local_2f8 = lVar30;
            local_2f0 = puVar38;
            if (local_288 == (float *)0x0) {
              lVar30 = 0;
              do {
                pfVar34 = local_308 + lVar30;
                fVar46 = pfVar34[1];
                fVar68 = pfVar34[2];
                fVar73 = pfVar34[3];
                local_1b8[lVar30 + 0x20] = *pfVar34 * *pfVar34;
                local_1b8[lVar30 + 0x21] = fVar46 * fVar46;
                local_1b8[lVar30 + 0x22] = fVar68 * fVar68;
                local_1b8[lVar30 + 0x23] = fVar73 * fVar73;
                lVar30 = lVar30 + 4;
              } while (lVar30 != 0x20);
            }
            else {
              lVar30 = 0;
              do {
                fVar46 = local_308[lVar30] * local_308[lVar30] + local_2e4;
                if (fVar46 < 0.0) {
                  local_2c8 = local_270[lVar30];
                  fVar46 = sqrtf(fVar46);
                  auVar90 = _DAT_0014e990;
                  auVar91 = _DAT_0014e690;
                  fVar68 = local_2c8;
                }
                else {
                  fVar46 = SQRT(fVar46);
                  fVar68 = local_270[lVar30];
                }
                local_1b8[lVar30 + 0x20] = fVar68 * fVar46;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 0x20);
            }
            lVar30 = 0;
            do {
              fVar46 = local_1b8[lVar30 + 0x20];
              if (fVar46 < 0.0) {
                fVar46 = sqrtf(fVar46);
                auVar90 = _DAT_0014e990;
                auVar91 = _DAT_0014e690;
              }
              else {
                fVar46 = SQRT(fVar46);
              }
              local_1b8[lVar30 + 0x40] = fVar46;
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x20);
            pfVar34 = local_1b8;
            lVar30 = 0;
            pfVar31 = local_308;
            do {
              lVar32 = 0;
              bVar37 = 0;
              do {
                fVar46 = pfVar31[lVar32];
                if (0.0 <= fVar46) {
                  pfVar34[lVar32] = fVar46;
                }
                else {
                  pfVar34[lVar32] = -fVar46;
                  bVar37 = bVar37 | (byte)(1 << ((byte)lVar32 & 0x1f));
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 != 8);
              *(byte *)((long)&local_30c + lVar30) = bVar37;
              lVar30 = lVar30 + 1;
              pfVar34 = pfVar34 + 8;
              pfVar31 = pfVar31 + 8;
            } while (lVar30 != 4);
            lVar30 = 1;
            fVar46 = local_1b8[0];
            do {
              if (fVar46 <= local_1b8[lVar30]) {
                fVar46 = local_1b8[lVar30];
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x20);
            if ((fVar46 != 0.0) || (NAN(fVar46))) {
              local_260 = 0;
              _local_2d8 = ZEXT416((uint)(fVar46 / 15.0));
              iVar35 = -9;
              _local_228 = ZEXT812(0);
              fStack_21c = 0.0;
              local_278 = 0;
              local_2e0 = fVar46;
              do {
                fVar86 = ((float)iVar35 * 0.2 + 15.0) / local_2e0;
                local_2dc = 1.0 / fVar86;
                pcVar39 = (char *)&local_218;
                lVar30 = 0;
                auVar80 = _DAT_0014e710;
                fVar46 = fVar86;
                fVar68 = fVar86;
                fVar73 = fVar86;
                local_2c8 = fVar86;
                fStack_2c4 = fVar86;
                fStack_2c0 = fVar86;
                fStack_2bc = fVar86;
                do {
                  fVar47 = (local_1b8[lVar30 * 4] * fVar86 + -1.0) * 0.5 + 12582912.0;
                  fVar67 = (local_1b8[lVar30 * 4 + 1] * fVar46 + -1.0) * 0.5 + 12582912.0;
                  auVar78._0_8_ = CONCAT44(fVar67,fVar47) & 0x7fffff007fffff;
                  auVar78._8_4_ =
                       (uint)((local_1b8[lVar30 * 4 + 2] * fVar68 + -1.0) * 0.5 + 12582912.0) &
                       0x7fffff;
                  auVar78._12_4_ =
                       (uint)((local_1b8[lVar30 * 4 + 3] * fVar73 + -1.0) * 0.5 + 12582912.0) &
                       0x7fffff;
                  auVar77._0_4_ = -(uint)((int)((uint)fVar47 & 0x7fffff) < auVar90._0_4_);
                  auVar77._4_4_ = -(uint)((int)((uint)fVar67 & 0x7fffff) < auVar90._4_4_);
                  auVar77._8_4_ = -(uint)((int)auVar78._8_4_ < auVar90._8_4_);
                  auVar77._12_4_ = -(uint)((int)auVar78._12_4_ < auVar90._12_4_);
                  auVar78 = ~auVar77 & auVar90 | auVar78 & auVar77;
                  auVar49._0_4_ = -(uint)(0x400000 < auVar78._0_4_);
                  auVar49._4_4_ = -(uint)(0x400000 < auVar78._4_4_);
                  auVar49._8_4_ = -(uint)(0x400000 < auVar78._8_4_);
                  auVar49._12_4_ = -(uint)(0x400000 < auVar78._12_4_);
                  auVar78 = auVar49 & auVar78 & auVar80;
                  sVar43 = auVar78._0_2_;
                  cVar4 = (0 < sVar43) * (sVar43 < 0x100) * auVar78[0] - (0xff < sVar43);
                  sVar43 = auVar78._2_2_;
                  sVar42 = CONCAT11((0 < sVar43) * (sVar43 < 0x100) * auVar78[2] - (0xff < sVar43),
                                    cVar4);
                  sVar43 = auVar78._4_2_;
                  cVar5 = (0 < sVar43) * (sVar43 < 0x100) * auVar78[4] - (0xff < sVar43);
                  sVar43 = auVar78._6_2_;
                  uVar70 = CONCAT13((0 < sVar43) * (sVar43 < 0x100) * auVar78[6] - (0xff < sVar43),
                                    CONCAT12(cVar5,sVar42));
                  sVar43 = auVar78._8_2_;
                  cVar6 = (0 < sVar43) * (sVar43 < 0x100) * auVar78[8] - (0xff < sVar43);
                  sVar43 = auVar78._10_2_;
                  uVar48 = CONCAT15((0 < sVar43) * (sVar43 < 0x100) * auVar78[10] - (0xff < sVar43),
                                    CONCAT14(cVar6,uVar70));
                  sVar43 = auVar78._12_2_;
                  cVar7 = (0 < sVar43) * (sVar43 < 0x100) * auVar78[0xc] - (0xff < sVar43);
                  sVar9 = auVar78._14_2_;
                  sVar43 = (short)((uint)uVar70 >> 0x10);
                  sVar8 = (short)((uint6)uVar48 >> 0x20);
                  sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar78[0xe] -
                                           (0xff < sVar9),CONCAT16(cVar7,uVar48)) >> 0x30);
                  *(uint *)((long)&local_218 + lVar30 * 4) =
                       CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9),
                                CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar6 - (0xff < sVar8),
                                         CONCAT11((0 < sVar43) * (sVar43 < 0x100) * cVar5 -
                                                  (0xff < sVar43),
                                                  (0 < sVar42) * (sVar42 < 0x100) * cVar4 -
                                                  (0xff < sVar42))));
                  lVar32 = 0;
                  uVar33 = 0;
                  pcVar36 = pcVar39;
                  do {
                    uVar33 = (ulong)((uint)uVar33 | (int)*pcVar36 << ((byte)lVar32 & 0x1f));
                    pcVar36 = pcVar36 + 1;
                    lVar32 = lVar32 + 3;
                  } while (lVar32 != 0xc);
                  iVar69 = piVar27[uVar33 & 0xffff];
                  *(undefined1 *)((long)&local_268 + lVar30) = 1;
                  if ((long)iVar69 < 0) {
                    *(undefined1 *)((long)&local_268 + lVar30) = 0;
                    iq3_find_best_neighbour
                              (puVar28 + (-1 - (long)iVar69),grid,local_1b8 + lVar30 * 4,
                               local_1b8 + lVar30 * 4 + 0x40,local_2dc,
                               (int8_t *)((long)&local_218 + lVar30 * 4));
                    auVar80 = _DAT_0014e710;
                    auVar90 = _DAT_0014e990;
                    auVar91 = _DAT_0014e690;
                    fVar86 = local_2c8;
                    fVar46 = fStack_2c4;
                    fVar68 = fStack_2c0;
                    fVar73 = fStack_2bc;
                  }
                  lVar30 = lVar30 + 1;
                  pcVar39 = pcVar39 + 4;
                } while (lVar30 != 8);
                fVar46 = 0.0;
                fVar68 = 0.0;
                fVar73 = 0.0;
                fVar86 = 0.0;
                lVar30 = 0;
                do {
                  fVar67 = (float)(*(char *)((long)&local_218 + lVar30) * 2 + 1);
                  fVar47 = local_1b8[lVar30 + 0x20];
                  fVar46 = fVar46 + fVar67 * local_1b8[lVar30] * fVar47;
                  fVar68 = fVar68 + fVar67 * fVar67 * fVar47;
                  fVar73 = fVar73 + fVar67 * fVar47 * 0.0;
                  fVar86 = fVar86 + fVar67 * fVar47 * 0.0;
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 0x20);
                if ((0.0 < fVar68) && ((float)local_228._0_4_ * fVar68 < fVar46 * fVar46)) {
                  local_1e8 = local_208;
                  uStack_1e0 = uStack_200;
                  local_1f8 = local_218;
                  uStack_1f0 = uStack_210;
                  local_278 = local_268;
                  local_2d8._4_4_ = fVar68;
                  local_2d8._0_4_ = fVar46 / fVar68;
                  fStack_2d0 = fVar73;
                  fStack_2cc = fVar86;
                  local_228._4_4_ = fVar68;
                  local_228._0_4_ = fVar46 * (fVar46 / fVar68);
                  fStack_220 = fVar73;
                  fStack_21c = fVar86;
                }
                iVar35 = iVar35 + 1;
              } while (iVar35 != 10);
              local_260 = local_278;
              iVar35 = 0;
              iVar69 = 0;
              iVar74 = 0;
              iVar75 = 0;
              lVar30 = 0;
              do {
                auVar76 = ZEXT415(*(uint *)((long)&local_260 + lVar30)) ^ auVar91._0_15_;
                auVar10[0xd] = 0;
                auVar10._0_13_ = auVar76._0_13_;
                auVar10[0xe] = auVar76[7];
                auVar12[0xc] = auVar76[6];
                auVar12._0_12_ = auVar76._0_12_;
                auVar12._13_2_ = auVar10._13_2_;
                auVar13[0xb] = 0;
                auVar13._0_11_ = auVar76._0_11_;
                auVar13._12_3_ = auVar12._12_3_;
                auVar14[10] = auVar76[5];
                auVar14._0_10_ = auVar76._0_10_;
                auVar14._11_4_ = auVar13._11_4_;
                auVar15[9] = 0;
                auVar15._0_9_ = auVar76._0_9_;
                auVar15._10_5_ = auVar14._10_5_;
                auVar16[8] = auVar76[4];
                auVar16._0_8_ = auVar76._0_8_;
                auVar16._9_6_ = auVar15._9_6_;
                auVar18._7_8_ = 0;
                auVar18._0_7_ = auVar16._8_7_;
                Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar76[3]);
                auVar24._9_6_ = 0;
                auVar24._0_9_ = Var19;
                auVar20._1_10_ = SUB1510(auVar24 << 0x30,5);
                auVar20[0] = auVar76[2];
                auVar25._11_4_ = 0;
                auVar25._0_11_ = auVar20;
                auVar21._1_12_ = SUB1512(auVar25 << 0x20,3);
                auVar21[0] = auVar76[1];
                uVar44 = CONCAT11(0,auVar76[0]);
                auVar76._2_13_ = auVar21;
                auVar76._0_2_ = uVar44;
                auVar11._10_2_ = 0;
                auVar11._0_10_ = auVar76._0_10_;
                auVar11._12_2_ = (short)Var19;
                uVar26 = CONCAT42(auVar11._10_4_,auVar20._0_2_);
                auVar22._6_8_ = 0;
                auVar22._0_6_ = uVar26;
                iVar35 = iVar35 + (uint)uVar44;
                iVar69 = iVar69 + (int)CONCAT82(SUB148(auVar22 << 0x40,6),auVar21._0_2_);
                iVar74 = iVar74 + (int)uVar26;
                iVar75 = iVar75 + (auVar11._10_4_ >> 0x10);
                lVar30 = lVar30 + 4;
              } while (lVar30 != 8);
              auVar80 = _local_2d8;
              if ((iVar75 + iVar69 + iVar74 + iVar35 != 0) && (0.0 < local_2d8._0_4_)) {
                fVar86 = 1.0 / local_2d8._0_4_;
                lVar30 = 0;
                L_00 = (int8_t *)&local_1f8;
                fVar46 = fVar86;
                fVar68 = fVar86;
                fVar73 = fVar86;
                local_2c8 = fVar86;
                fStack_2c4 = fVar86;
                fStack_2c0 = fVar86;
                fStack_2bc = fVar86;
                do {
                  fVar47 = (*(float *)((long)local_1b8 + lVar30) * fVar86 + -1.0) * 0.5 + 12582912.0
                  ;
                  fVar67 = (*(float *)((long)local_1b8 + lVar30 + 4) * fVar46 + -1.0) * 0.5 +
                           12582912.0;
                  auVar50._0_8_ = CONCAT44(fVar67,fVar47) & 0x7fffff007fffff;
                  auVar50._8_4_ =
                       (uint)((*(float *)((long)local_1b8 + lVar30 + 8) * fVar68 + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
                  auVar50._12_4_ =
                       (uint)((*(float *)((long)local_1b8 + lVar30 + 0xc) * fVar73 + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
                  auVar79._0_4_ = -(uint)((int)((uint)fVar47 & 0x7fffff) < auVar90._0_4_);
                  auVar79._4_4_ = -(uint)((int)((uint)fVar67 & 0x7fffff) < auVar90._4_4_);
                  auVar79._8_4_ = -(uint)((int)auVar50._8_4_ < auVar90._8_4_);
                  auVar79._12_4_ = -(uint)((int)auVar50._12_4_ < auVar90._12_4_);
                  auVar80 = ~auVar79 & auVar90 | auVar50 & auVar79;
                  auVar51._0_4_ = -(uint)(0x400000 < auVar80._0_4_);
                  auVar51._4_4_ = -(uint)(0x400000 < auVar80._4_4_);
                  auVar51._8_4_ = -(uint)(0x400000 < auVar80._8_4_);
                  auVar51._12_4_ = -(uint)(0x400000 < auVar80._12_4_);
                  auVar80 = pshuflw(auVar51 & auVar80,auVar51 & auVar80,0xe8);
                  auVar80 = pshufhw(auVar80,auVar80,0xe8);
                  auVar52._0_8_ =
                       CONCAT26(auVar80._10_2_ * 0x200,
                                CONCAT24(auVar80._8_2_ * 0x40,
                                         CONCAT22(auVar80._2_2_ * 8,auVar80._0_2_)));
                  auVar52._8_8_ = 0;
                  uVar70 = (undefined4)(auVar52._0_8_ >> 0x20);
                  auVar81._4_4_ = uVar70;
                  auVar81._0_4_ = uVar70;
                  auVar81._8_4_ = uVar70;
                  auVar81._12_4_ = uVar70;
                  uVar29 = piVar27[(ushort)(SUB162(auVar81 | auVar52,2) |
                                           SUB162(auVar81 | auVar52,0))];
                  if ((long)(int)uVar29 < 0) {
                    uVar29 = iq3_find_best_neighbour
                                       (puVar28 + (-1 - (long)(int)uVar29),grid,
                                        (float *)((long)local_1b8 + lVar30),
                                        (float *)((long)local_1b8 + lVar30 + 0x100),
                                        (float)local_2d8._0_4_,L_00);
                    auVar90 = _DAT_0014e990;
                    auVar91 = _DAT_0014e690;
                    fVar86 = local_2c8;
                    fVar46 = fStack_2c4;
                    fVar68 = fStack_2c0;
                    fVar73 = fStack_2bc;
                  }
                  uVar3 = grid[uVar29];
                  uVar61 = (undefined1)(uVar3 >> 0x18);
                  uVar62 = CONCAT11(uVar61,uVar61);
                  uVar61 = (undefined1)(uVar3 >> 0x10);
                  uVar17 = CONCAT35(CONCAT21(uVar62,uVar61),CONCAT14(uVar61,uVar3));
                  uVar61 = (undefined1)(uVar3 >> 8);
                  uVar48 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar61),uVar61);
                  sVar43 = CONCAT11((char)uVar3,(char)uVar3);
                  uVar33 = CONCAT62(uVar48,sVar43);
                  auVar55._8_4_ = 0;
                  auVar55._0_8_ = uVar33;
                  auVar55._12_2_ = uVar62;
                  auVar55._14_2_ = uVar62;
                  uVar62 = (undefined2)((ulong)uVar17 >> 0x20);
                  auVar54._12_4_ = auVar55._12_4_;
                  auVar54._8_2_ = 0;
                  auVar54._0_8_ = uVar33;
                  auVar54._10_2_ = uVar62;
                  auVar53._10_6_ = auVar54._10_6_;
                  auVar53._8_2_ = uVar62;
                  auVar53._0_8_ = uVar33;
                  uVar62 = (undefined2)uVar48;
                  auVar23._4_8_ = auVar53._8_8_;
                  auVar23._2_2_ = uVar62;
                  auVar23._0_2_ = uVar62;
                  auVar56._0_4_ = ((int)sVar43 >> 8) + -1;
                  auVar56._4_4_ = (auVar23._0_4_ >> 0x18) + -1;
                  auVar56._8_4_ = (auVar53._8_4_ >> 0x18) + -1;
                  auVar56._12_4_ = (auVar54._12_4_ >> 0x18) + -1;
                  auVar80 = packssdw(auVar56,auVar56);
                  uVar44 = -(short)(auVar56._0_4_ >> 0x1f);
                  cVar4 = -(char)(auVar56._0_4_ >> 0x1f);
                  auVar57[1] = 0;
                  auVar57[0] = (uVar44 != 0) * (uVar44 < 0x100) * cVar4 - (0xff < uVar44);
                  uVar45 = -(short)(auVar56._4_4_ >> 0x1f);
                  cVar5 = -(char)(auVar56._4_4_ >> 0x1f);
                  auVar57[2] = (uVar45 != 0) * (uVar45 < 0x100) * cVar5 - (0xff < uVar45);
                  auVar57[3] = 0;
                  uVar63 = -(short)(auVar56._8_4_ >> 0x1f);
                  cVar6 = (char)(auVar56._8_4_ >> 0x1f);
                  auVar57[4] = (uVar63 != 0) * (uVar63 < 0x100) * -cVar6 - (0xff < uVar63);
                  auVar57[5] = 0;
                  sVar43 = (short)(auVar56._12_4_ >> 0x1f);
                  uVar64 = -sVar43;
                  cVar7 = (char)(auVar56._12_4_ >> 0x1f);
                  auVar57[6] = (uVar64 != 0) * (uVar64 < 0x100) * -cVar7 - (0xff < uVar64);
                  auVar57[7] = 0;
                  auVar57[8] = (uVar44 != 0) * (uVar44 < 0x100) * cVar4 - (0xff < uVar44);
                  auVar57[9] = 0;
                  auVar57[10] = (uVar45 != 0) * (uVar45 < 0x100) * cVar5 - (0xff < uVar45);
                  auVar57[0xb] = 0;
                  auVar57[0xc] = (uVar63 != 0) * (uVar63 < 0x100) * -cVar6 - (0xff < uVar63);
                  auVar57[0xd] = 0;
                  uVar44 = -sVar43;
                  auVar57[0xe] = (uVar44 != 0) * (uVar44 < 0x100) * -cVar7 - (0xff < uVar44);
                  auVar57[0xf] = 0;
                  auVar78 = auVar80 & auVar57;
                  auVar57 = auVar57 ^ auVar80;
                  uVar44 = (auVar57._0_2_ >> 1) + auVar78._0_2_;
                  uVar63 = (auVar57._2_2_ >> 1) + auVar78._2_2_;
                  uVar65 = (auVar57._4_2_ >> 1) + auVar78._4_2_;
                  uVar71 = (auVar57._6_2_ >> 1) + auVar78._6_2_;
                  uVar45 = uVar44 & 0xff;
                  uVar64 = uVar63 & 0xff;
                  uVar66 = uVar65 & 0xff;
                  uVar72 = uVar71 & 0xff;
                  *(uint *)L_00 =
                       CONCAT13((uVar72 != 0) * (uVar72 < 0x100) * (char)uVar71 - (0xff < uVar72),
                                CONCAT12((uVar66 != 0) * (uVar66 < 0x100) * (char)uVar65 -
                                         (0xff < uVar66),
                                         CONCAT11((uVar64 != 0) * (uVar64 < 0x100) * (char)uVar63 -
                                                  (0xff < uVar64),
                                                  (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar44 -
                                                  (0xff < uVar45))));
                  L_00 = L_00 + 4;
                  lVar30 = lVar30 + 0x10;
                } while (lVar30 != 0x80);
                fVar46 = 0.0;
                fVar68 = 0.0;
                lVar30 = 0;
                do {
                  fVar73 = (float)(*(char *)((long)&local_1f8 + lVar30) * 2 + 1);
                  fVar46 = fVar46 + fVar73 * fVar73 * local_1b8[lVar30 + 0x20];
                  fVar68 = fVar68 + fVar73 * local_1b8[lVar30] * local_1b8[lVar30 + 0x20];
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 0x20);
                auVar83._0_4_ = ~-(uint)(0.0 < fVar46) & local_2d8._0_4_;
                auVar83._4_4_ = local_2d8._4_4_;
                auVar83._8_4_ = fStack_2d0;
                auVar83._12_4_ = fStack_2cc;
                auVar80 = auVar83 | ZEXT416((uint)(fVar68 / fVar46) & -(uint)(0.0 < fVar46));
              }
              auVar87 = auVar80;
              if (auVar80._0_4_ < 0.0) {
                local_30c = ~local_30c;
                auVar87._0_4_ = -auVar80._0_4_;
                auVar87._4_4_ = 0;
                auVar87._8_4_ = auVar80._8_4_ ^ 0x80000000;
                auVar87._12_4_ = auVar80._12_4_ ^ 0x80000000;
              }
              pcVar39 = (char *)&local_1f8;
              lVar30 = 0;
              do {
                lVar32 = 0;
                uVar29 = 0;
                pcVar36 = pcVar39;
                do {
                  uVar29 = uVar29 | (int)*pcVar36 << ((byte)lVar32 & 0x1f);
                  pcVar36 = pcVar36 + 1;
                  lVar32 = lVar32 + 3;
                } while (lVar32 != 0xc);
                uVar29 = piVar27[uVar29 & 0xffff];
                if ((int)uVar29 < 0) {
                  printf("Oops: found point %u not on grid:");
                  lVar30 = 4;
                  do {
                    printf(" %d",(ulong)(uint)(int)*pcVar39);
                    pcVar39 = pcVar39 + 1;
                    lVar30 = lVar30 + -1;
                  } while (lVar30 != 0);
                  putchar(10);
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                             ,0xf59,"fatal error");
                }
                *(char *)((long)local_2f0 + lVar30) = (char)uVar29;
                pbVar2 = (byte *)((long)local_300 + local_2f8 + 0x42);
                *pbVar2 = *pbVar2 | (byte)((uVar29 >> 8) << ((byte)lVar30 & 0x1f));
                lVar30 = lVar30 + 1;
                pcVar39 = pcVar39 + 4;
              } while (lVar30 != 8);
              *local_280 = local_30c;
              fVar46 = auVar87._0_4_;
              if (fVar46 < 0.0) {
                pcVar39 = "scale >= 0";
                iVar35 = 0xf61;
                goto LAB_001378c5;
              }
              puVar38 = local_2f0 + 4;
              local_280 = local_280 + 1;
              local_1d8[local_2f8] = fVar46;
              puVar40 = local_300;
              pfVar41 = local_230;
              if (fVar85 <= fVar46) {
                fVar85 = fVar46;
              }
            }
            else {
              local_1d8[local_2f8] = 0.0;
              puVar38 = local_2f0;
            }
            lVar30 = local_2f8 + 1;
            local_308 = local_308 + 0x20;
            local_270 = local_270 + 0x20;
          } while (lVar30 != 8);
          if ((fVar85 != 0.0) || (NAN(fVar85))) {
            fVar68 = (fVar85 / 31.0) * 1.033;
            fVar46 = (float)(((uint)fVar68 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar68 * 2) < 0x71000000) {
              fVar46 = 2.0;
            }
            fVar46 = fVar46 + ABS(fVar68) * 5.192297e+33 * 7.70372e-34;
            fVar86 = 1.0 / (fVar85 / 31.0);
            fVar85 = (local_1d8[0] * fVar86 + -1.0) * 0.5 + 12582912.0;
            fVar73 = (local_1d8[2] * fVar86 + -1.0) * 0.5 + 12582912.0;
            auVar88._0_8_ = CONCAT44(fVar73,fVar85) & 0x7fffff007fffff;
            auVar88._8_4_ = (uint)((local_1c8 * fVar86 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar88._12_4_ = (uint)((fStack_1c0 * fVar86 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar84._0_4_ = -(uint)((int)((uint)fVar85 & 0x7fffff) < (int)DAT_0014e7c0);
            auVar84._4_4_ = -(uint)((int)((uint)fVar73 & 0x7fffff) < DAT_0014e7c0._4_4_);
            auVar84._8_4_ = -(uint)((int)auVar88._8_4_ < DAT_0014e7c0._8_4_);
            auVar84._12_4_ = -(uint)((int)auVar88._12_4_ < DAT_0014e7c0._12_4_);
            auVar78 = ~auVar84 & _DAT_0014e7c0 | auVar88 & auVar84;
            auVar89._0_4_ = -(uint)(0x400000 < auVar78._0_4_);
            auVar89._4_4_ = -(uint)(0x400000 < auVar78._4_4_);
            auVar89._8_4_ = -(uint)(0x400000 < auVar78._8_4_);
            auVar89._12_4_ = -(uint)(0x400000 < auVar78._12_4_);
            fVar85 = (local_1d8[1] * fVar86 + -1.0) * 0.5 + 12582912.0;
            fVar73 = (local_1d8[3] * fVar86 + -1.0) * 0.5 + 12582912.0;
            auVar58._0_8_ = CONCAT44(fVar73,fVar85) & 0x7fffff007fffff;
            auVar58._8_4_ = (uint)((fStack_1c4 * fVar86 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar58._12_4_ = (uint)((fStack_1bc * fVar86 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
            auVar82._0_4_ = -(uint)((int)((uint)fVar85 & 0x7fffff) < (int)DAT_0014e7c0);
            auVar82._4_4_ = -(uint)((int)((uint)fVar73 & 0x7fffff) < DAT_0014e7c0._4_4_);
            auVar82._8_4_ = -(uint)((int)auVar58._8_4_ < DAT_0014e7c0._8_4_);
            auVar82._12_4_ = -(uint)((int)auVar58._12_4_ < DAT_0014e7c0._12_4_);
            auVar80 = ~auVar82 & _DAT_0014e7c0 | auVar58 & auVar82;
            auVar59._0_4_ = -(uint)(0x400000 < auVar80._0_4_);
            auVar59._4_4_ = -(uint)(0x400000 < auVar80._4_4_);
            auVar59._8_4_ = -(uint)(0x400000 < auVar80._8_4_);
            auVar59._12_4_ = -(uint)(0x400000 < auVar80._12_4_);
            auVar59 = auVar59 & auVar80;
            auVar60._0_4_ = auVar59._0_4_ << 4;
            auVar60._4_4_ = auVar59._4_4_ << 4;
            auVar60._8_4_ = auVar59._8_4_ << 4;
            auVar60._12_4_ = auVar59._12_4_ << 4;
            uVar44 = (SUB42(fVar46,0) & 0xfff) + ((ushort)((uint)fVar46 >> 0xd) & 0x7c00);
            if (0xff000000 < (uint)((int)fVar68 * 2)) {
              uVar44 = 0x7e00;
            }
            *puVar40 = uVar44 | (ushort)((uint)fVar68 >> 0x10) & 0x8000;
            auVar80 = (auVar60 | auVar89 & auVar78) & _DAT_0014e710;
            sVar43 = auVar80._0_2_;
            cVar4 = (0 < sVar43) * (sVar43 < 0x100) * auVar80[0] - (0xff < sVar43);
            sVar43 = auVar80._2_2_;
            sVar42 = CONCAT11((0 < sVar43) * (sVar43 < 0x100) * auVar80[2] - (0xff < sVar43),cVar4);
            sVar43 = auVar80._4_2_;
            cVar5 = (0 < sVar43) * (sVar43 < 0x100) * auVar80[4] - (0xff < sVar43);
            sVar43 = auVar80._6_2_;
            uVar70 = CONCAT13((0 < sVar43) * (sVar43 < 0x100) * auVar80[6] - (0xff < sVar43),
                              CONCAT12(cVar5,sVar42));
            sVar43 = auVar80._8_2_;
            cVar6 = (0 < sVar43) * (sVar43 < 0x100) * auVar80[8] - (0xff < sVar43);
            sVar43 = auVar80._10_2_;
            uVar48 = CONCAT15((0 < sVar43) * (sVar43 < 0x100) * auVar80[10] - (0xff < sVar43),
                              CONCAT14(cVar6,uVar70));
            sVar43 = auVar80._12_2_;
            cVar7 = (0 < sVar43) * (sVar43 < 0x100) * auVar80[0xc] - (0xff < sVar43);
            sVar9 = auVar80._14_2_;
            sVar43 = (short)((uint)uVar70 >> 0x10);
            sVar8 = (short)((uint6)uVar48 >> 0x20);
            sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar80[0xe] - (0xff < sVar9),
                                     CONCAT16(cVar7,uVar48)) >> 0x30);
            *(uint *)(puVar40 + 0x35) =
                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9),
                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar6 - (0xff < sVar8),
                                   CONCAT11((0 < sVar43) * (sVar43 < 0x100) * cVar5 -
                                            (0xff < sVar43),
                                            (0 < sVar42) * (sVar42 < 0x100) * cVar4 -
                                            (0xff < sVar42))));
          }
          uVar33 = local_238 + 1;
          pfVar41 = pfVar41 + 0x100;
          local_290 = local_290 + 0x100;
        } while (uVar33 != local_2a0);
      }
      local_298 = (void *)((long)local_298 + local_258);
      lVar30 = local_240 + 1;
      local_2a8 = (float *)((long)local_2a8 + local_250);
      nrow = local_248;
    } while (lVar30 != local_248);
  }
  return nrow * local_2b0 * 0x6e;
}

Assistant:

size_t quantize_iq3_s(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    float scales[QK_K/IQ3S_BLOCK_SIZE];
    float weight[IQ3S_BLOCK_SIZE];
    float xval[IQ3S_BLOCK_SIZE];
    int8_t L[IQ3S_BLOCK_SIZE];
    int8_t Laux[IQ3S_BLOCK_SIZE];
    float  waux[IQ3S_BLOCK_SIZE];
    bool   is_on_grid[IQ3S_BLOCK_SIZE/4];
    bool   is_on_grid_aux[IQ3S_BLOCK_SIZE/4];
    uint8_t block_signs[IQ3S_BLOCK_SIZE/8];
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq3_s_impl(IQ3S_BLOCK_SIZE, src, qrow, n_per_row, quant_weights,
                scales, weight, xval, L, Laux, waux, is_on_grid, is_on_grid_aux, block_signs);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq3_s);
    }
    return nrow * nblock * sizeof(block_iq3_s);
}